

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_8df1c::CheckVariableConflict
          (anon_unknown_dwarf_8df1c *this,ExpressionContext *ctx,SynBase *source,InplaceStr name)

{
  uint uVar1;
  TypeBase *pTVar2;
  IdentifierLookupResult *pIVar3;
  NamespaceData *pNVar4;
  anon_unknown_dwarf_8df1c *paVar5;
  InplaceStr name_00;
  IdentifierLookupResult *lookup;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  InplaceStr name_local;
  
  paVar5 = (anon_unknown_dwarf_8df1c *)name.begin;
  ctx_local = (ExpressionContext *)source;
  name_local.begin = (char *)paVar5;
  uVar1 = InplaceStr::hash((InplaceStr *)&ctx_local);
  pTVar2 = LookupTypeByName((ExpressionContext *)this,uVar1);
  if (pTVar2 != (TypeBase *)0x0) {
    Report((ExpressionContext *)this,(SynBase *)ctx,
           "ERROR: name \'%.*s\' is already taken for a type",
           (ulong)(uint)((int)name_local.begin - (int)ctx_local),ctx_local);
    return true;
  }
  uVar1 = InplaceStr::hash((InplaceStr *)&ctx_local);
  pIVar3 = LookupObjectByName((ExpressionContext *)this,uVar1);
  if (pIVar3 != (IdentifierLookupResult *)0x0) {
    if ((pIVar3->variable != (VariableData *)0x0) &&
       (paVar5 = this, pIVar3->variable->scope == *(ScopeData **)(this + 0x8158))) {
      Report((ExpressionContext *)this,(SynBase *)ctx,
             "ERROR: name \'%.*s\' is already taken for a variable in current scope",
             (ulong)(uint)((int)name_local.begin - (int)ctx_local),ctx_local);
      return true;
    }
    if ((pIVar3->function != (FunctionData *)0x0) &&
       (paVar5 = this, pIVar3->function->scope == *(ScopeData **)(this + 0x8158))) {
      Report((ExpressionContext *)this,(SynBase *)ctx,
             "ERROR: name \'%.*s\' is already taken for a function",
             (ulong)(uint)((int)name_local.begin - (int)ctx_local),ctx_local);
      return true;
    }
  }
  name_00.end = (char *)paVar5;
  name_00.begin = name_local.begin;
  pNVar4 = FindNamespaceInCurrentScope(this,ctx_local,name_00);
  if (pNVar4 != (NamespaceData *)0x0) {
    Report((ExpressionContext *)this,(SynBase *)ctx,
           "ERROR: name \'%.*s\' is already taken for a namespace",
           (ulong)(uint)((int)name_local.begin - (int)ctx_local),ctx_local);
  }
  return pNVar4 != (NamespaceData *)0x0;
}

Assistant:

bool CheckVariableConflict(ExpressionContext &ctx, SynBase *source, InplaceStr name)
	{
		if(LookupTypeByName(ctx, name.hash()))
		{
			Report(ctx, source, "ERROR: name '%.*s' is already taken for a type", FMT_ISTR(name));
			return true;
		}

		if(IdentifierLookupResult *lookup = LookupObjectByName(ctx, name.hash()))
		{
			if(lookup->variable && lookup->variable->scope == ctx.scope)
			{
				Report(ctx, source, "ERROR: name '%.*s' is already taken for a variable in current scope", FMT_ISTR(name));
				return true;
			}

			if(lookup->function && lookup->function->scope == ctx.scope)
			{
				Report(ctx, source, "ERROR: name '%.*s' is already taken for a function", FMT_ISTR(name));
				return true;
			}
		}

		if(FindNamespaceInCurrentScope(ctx, name))
		{
			Report(ctx, source, "ERROR: name '%.*s' is already taken for a namespace", FMT_ISTR(name));
			return true;
		}

		return false;
	}